

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O0

void usrc_writeUCPTrieArrays
               (FILE *f,char *indexPrefix,char *dataPrefix,UCPTrie *pTrie,char *postfix)

{
  int32_t local_3c;
  int32_t local_38;
  int32_t width;
  char *postfix_local;
  UCPTrie *pTrie_local;
  char *dataPrefix_local;
  char *indexPrefix_local;
  FILE *f_local;
  
  usrc_writeArray(f,indexPrefix,pTrie->index,0x10,pTrie->indexLength,postfix);
  if (pTrie->valueWidth == '\0') {
    local_38 = 0x10;
  }
  else {
    if (pTrie->valueWidth == '\x01') {
      local_3c = 0x20;
    }
    else {
      local_3c = 0;
      if (pTrie->valueWidth == '\x02') {
        local_3c = 8;
      }
    }
    local_38 = local_3c;
  }
  usrc_writeArray(f,dataPrefix,(pTrie->data).ptr0,local_38,pTrie->dataLength,postfix);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrieArrays(FILE *f,
                        const char *indexPrefix, const char *dataPrefix,
                        const UCPTrie *pTrie,
                        const char *postfix) {
    usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength, postfix);
    int32_t width=
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_16 ? 16 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_32 ? 32 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_8 ? 8 : 0;
    usrc_writeArray(f, dataPrefix, pTrie->data.ptr0, width, pTrie->dataLength, postfix);
}